

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

int fmt::v7::detail::format_float<long_double>
              (longdouble value,int precision,float_specs specs,buffer<char> *buf)

{
  fp x;
  float_specs specs_00;
  int iVar1;
  char *pcVar2;
  ulong remainder_00;
  buffer<char> *in_RDX;
  undefined8 extraout_RDX;
  undefined8 in_RSI;
  int in_EDI;
  decimal_fp<double> dVar3;
  fp fVar4;
  fp value_00;
  longdouble in_stack_00000008;
  size_t num_digits;
  fixed_handler handler;
  int max_double_digits;
  fp cached_pow;
  fp normalized;
  int cached_exp10;
  int min_exp;
  int exp;
  decimal_fp<double> dec;
  decimal_fp<float> dec_1;
  int *in_stack_00000168;
  bool fixed;
  undefined1 in_stack_0000017b;
  char digit_1;
  uint64_t remainder;
  anon_class_16_2_fdf32556 divmod_integral;
  uint32_t digit;
  result result;
  uint64_t fractional;
  uint32_t integral;
  fp one;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 uVar5;
  undefined4 in_stack_fffffffffffffdec;
  undefined4 uVar6;
  undefined2 in_stack_fffffffffffffdf0;
  undefined2 uVar7;
  undefined6 in_stack_fffffffffffffdf2;
  undefined2 in_stack_fffffffffffffdf8;
  undefined2 in_stack_fffffffffffffdfa;
  int in_stack_fffffffffffffdfc;
  undefined4 in_stack_fffffffffffffe00;
  uint in_stack_fffffffffffffe04;
  int *in_stack_fffffffffffffe08;
  uint64_t in_stack_fffffffffffffe10;
  fixed_handler *in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe24;
  fixed_handler *in_stack_fffffffffffffe28;
  size_t local_1d0;
  char *local_1b8;
  int local_1b0;
  float in_stack_fffffffffffffe54;
  undefined4 in_stack_fffffffffffffe60;
  uint in_stack_fffffffffffffe64;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> in_stack_fffffffffffffe68;
  double in_stack_fffffffffffffe98;
  buffer<char> *in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffecc;
  undefined8 in_stack_fffffffffffffed0;
  undefined2 in_stack_fffffffffffffed8;
  detail *local_120;
  uint local_118;
  int in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  undefined4 uStack_10c;
  int local_f4 [5];
  significand_type local_e0;
  int local_d8;
  decimal_fp<float> local_bc;
  undefined1 local_ab;
  undefined1 local_aa;
  byte local_a9;
  buffer<char> *local_a8;
  int local_9c;
  undefined8 local_80;
  int local_78;
  char local_71;
  long local_70;
  anon_class_16_2_fdf32556 local_68;
  uint32_t local_58;
  result local_54;
  ulong local_50;
  uint32_t local_44;
  fp local_40;
  char **local_30;
  int *local_28;
  long local_20;
  ulong local_18;
  int local_10;
  result local_4;
  
  local_80._4_1_ = (char)((ulong)in_RSI >> 0x20);
  local_a9 = local_80._4_1_ == '\x02';
  local_a8 = in_RDX;
  local_9c = in_EDI;
  if ((longdouble)0 < in_stack_00000008) {
    local_80._4_4_ = (uint)((ulong)in_RSI >> 0x20);
    if ((local_80._4_4_ >> 0x13 & 1) == 0) {
      specs_00._4_4_ = in_stack_fffffffffffffef0;
      specs_00.precision = in_stack_fffffffffffffeec;
      local_78 = snprintf_float<long_double>
                           ((longdouble)
                            CONCAT28(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0),
                            in_stack_fffffffffffffecc,specs_00,in_stack_fffffffffffffec0);
    }
    else if (in_EDI < 0) {
      if ((local_80._4_4_ >> 0x12 & 1) == 0) {
        dVar3 = dragonbox::to_decimal<double>(in_stack_fffffffffffffe98);
        local_e0 = dVar3.significand;
        local_d8 = dVar3.exponent;
        buffer_appender<char>::buffer_appender
                  ((buffer_appender<char> *)
                   CONCAT62(in_stack_fffffffffffffdf2,in_stack_fffffffffffffdf0),
                   (buffer<char> *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
        write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_long,_0>
                  ((buffer_appender<char>)in_stack_fffffffffffffe68.container,
                   CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
        local_78 = local_d8;
      }
      else {
        local_bc = dragonbox::to_decimal<float>(in_stack_fffffffffffffe54);
        buffer_appender<char>::buffer_appender
                  ((buffer_appender<char> *)
                   CONCAT62(in_stack_fffffffffffffdf2,in_stack_fffffffffffffdf0),
                   (buffer<char> *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
        write<char,_fmt::v7::detail::buffer_appender<char>,_unsigned_int,_0>
                  ((buffer_appender<char>)in_stack_fffffffffffffe68.container,
                   in_stack_fffffffffffffe64);
        local_78 = local_bc.exponent;
      }
    }
    else {
      local_f4[0] = 0;
      uVar5 = SUB104(in_stack_00000008,0);
      uVar6 = (undefined4)((unkuint10)in_stack_00000008 >> 0x20);
      uVar7 = (undefined2)((unkuint10)in_stack_00000008 >> 0x40);
      local_80 = in_RSI;
      fp::fp<long_double>((fp *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                          (longdouble)
                          CONCAT28(in_stack_fffffffffffffdf8,
                                   CONCAT62(in_stack_fffffffffffffdf2,uVar7)));
      value_00.f = (ulong)local_118;
      value_00._8_8_ = extraout_RDX;
      normalize<0>(local_120,value_00);
      get_cached_power((int)(in_stack_fffffffffffffe10 >> 0x20),in_stack_fffffffffffffe08);
      x.f._2_2_ = in_stack_fffffffffffffdfa;
      x.f._0_2_ = in_stack_fffffffffffffdf8;
      x.f._4_4_ = in_stack_fffffffffffffdfc;
      x.e = in_stack_fffffffffffffe00;
      x._12_4_ = in_stack_fffffffffffffe04;
      fVar4.f._4_4_ = uVar6;
      fVar4.f._0_4_ = uVar5;
      fVar4.e._0_2_ = uVar7;
      fVar4._10_6_ = in_stack_fffffffffffffdf2;
      fVar4 = operator*(x,fVar4);
      local_10 = fVar4.e;
      uVar5 = (undefined4)fVar4.f;
      uStack_10c = fVar4.f._4_4_;
      if (0x2ff < local_9c) {
        local_9c = 0x2ff;
      }
      local_1b8 = buffer<char>::data(local_a8);
      local_1b0 = 0;
      local_18 = CONCAT44(uStack_10c,uVar5);
      local_20 = 1;
      local_28 = local_f4;
      local_30 = &local_1b8;
      fp::fp(&local_40,1L << (-(char)fVar4.e & 0x3fU),local_10);
      local_44 = (uint32_t)(local_18 >> (-(char)local_40.e & 0x3fU));
      local_50 = local_18 & local_40.f - 1;
      iVar1 = count_digits(local_44);
      *local_28 = iVar1;
      local_4 = fixed_handler::on_start
                          (in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
                           (uint64_t)in_stack_fffffffffffffe08,
                           CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                           (int *)CONCAT44(in_stack_fffffffffffffdfc,
                                           CONCAT22(in_stack_fffffffffffffdfa,
                                                    in_stack_fffffffffffffdf8)));
      if (local_4 == more) {
        do {
          local_54 = 0;
          local_58 = 0;
          local_68.digit = &local_58;
          local_68.integral = &local_44;
          remainder_00 = (ulong)(*local_28 - 1);
          switch(remainder_00) {
          case 0:
            local_58 = local_44;
            local_44 = 0;
            break;
          case 1:
            grisu_gen_digits<fmt::v7::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      (&local_68,10);
            break;
          case 2:
            grisu_gen_digits<fmt::v7::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      (&local_68,100);
            break;
          case 3:
            grisu_gen_digits<fmt::v7::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      (&local_68,1000);
            break;
          case 4:
            grisu_gen_digits<fmt::v7::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      (&local_68,10000);
            break;
          case 5:
            grisu_gen_digits<fmt::v7::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      (&local_68,100000);
            break;
          case 6:
            grisu_gen_digits<fmt::v7::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      (&local_68,1000000);
            break;
          case 7:
            grisu_gen_digits<fmt::v7::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      (&local_68,10000000);
            break;
          case 8:
            grisu_gen_digits<fmt::v7::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      (&local_68,100000000);
            break;
          case 9:
            grisu_gen_digits<fmt::v7::detail::fixed_handler>::anon_class_16_2_fdf32556::operator()
                      (&local_68,1000000000);
          }
          *local_28 = *local_28 + -1;
          local_70 = ((ulong)local_44 << (-(char)local_40.e & 0x3fU)) + local_50;
          local_4 = fixed_handler::on_digit
                              (in_stack_fffffffffffffe28,
                               (char)((uint)in_stack_fffffffffffffe24 >> 0x18),
                               (uint64_t)in_stack_fffffffffffffe18,remainder_00,
                               (uint64_t)in_stack_fffffffffffffe08,in_stack_fffffffffffffe04,
                               SUB41((uint)in_stack_fffffffffffffe00 >> 0x18,0));
          if (local_4 != more) goto LAB_00161178;
        } while (0 < *local_28);
        do {
          local_54 = 0;
          local_20 = local_20 * 10;
          local_71 = (char)(local_50 * 10 >> (-(char)local_40.e & 0x3fU)) + '0';
          local_50 = local_40.f - 1 & local_50 * 10;
          *local_28 = *local_28 + -1;
          local_4 = fixed_handler::on_digit
                              (in_stack_fffffffffffffe28,
                               (char)((uint)in_stack_fffffffffffffe24 >> 0x18),
                               (uint64_t)in_stack_fffffffffffffe18,remainder_00,
                               (uint64_t)in_stack_fffffffffffffe08,in_stack_fffffffffffffe04,
                               SUB41((uint)in_stack_fffffffffffffe00 >> 0x18,0));
        } while (local_4 == more);
      }
LAB_00161178:
      local_54 = local_4;
      if (local_4 == error) {
        local_f4[0] = local_1b0 + -1 + local_f4[0];
        fallback_format<long_double>(value,precision,(bool)in_stack_0000017b,buf,in_stack_00000168);
      }
      else {
        to_unsigned<int>(local_1b0);
        buffer<char>::try_resize
                  ((buffer<char> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                   CONCAT44(in_stack_fffffffffffffdfc,
                            CONCAT22(in_stack_fffffffffffffdfa,in_stack_fffffffffffffdf8)));
      }
      if (((local_a9 & 1) == 0) && ((local_80._4_4_ >> 0x14 & 1) == 0)) {
        local_1d0 = buffer<char>::size(local_a8);
        while( true ) {
          in_stack_fffffffffffffe04 = in_stack_fffffffffffffe04 & 0xffffff;
          if (local_1d0 != 0) {
            pcVar2 = buffer<char>::operator[]<unsigned_long>(local_a8,local_1d0 - 1);
            in_stack_fffffffffffffe04 = CONCAT13(*pcVar2 == '0',(int3)in_stack_fffffffffffffe04);
          }
          if ((char)(in_stack_fffffffffffffe04 >> 0x18) == '\0') break;
          local_1d0 = local_1d0 - 1;
          local_f4[0] = local_f4[0] + 1;
        }
        buffer<char>::try_resize
                  ((buffer<char> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                   CONCAT44(in_stack_fffffffffffffdfc,
                            CONCAT22(in_stack_fffffffffffffdfa,in_stack_fffffffffffffdf8)));
      }
      local_78 = local_f4[0];
    }
  }
  else if ((in_EDI < 1) || (!(bool)local_a9)) {
    local_aa = 0x30;
    buffer<char>::push_back
              ((buffer<char> *)CONCAT62(in_stack_fffffffffffffdf2,in_stack_fffffffffffffdf0),
               (char *)CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
    local_78 = 0;
  }
  else {
    to_unsigned<int>(in_EDI);
    buffer<char>::try_resize
              ((buffer<char> *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
               CONCAT44(in_stack_fffffffffffffdfc,
                        CONCAT22(in_stack_fffffffffffffdfa,in_stack_fffffffffffffdf8)));
    buffer<char>::data(local_a8);
    local_ab = 0x30;
    std::uninitialized_fill_n<char*,int,char>
              ((char *)CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
               in_stack_fffffffffffffdfc,
               (char *)CONCAT62(in_stack_fffffffffffffdf2,in_stack_fffffffffffffdf0));
    local_78 = -local_9c;
  }
  return local_78;
}

Assistant:

int format_float(T value, int precision, float_specs specs, buffer<char>& buf) {
  static_assert(!std::is_same<T, float>::value, "");
  FMT_ASSERT(value >= 0, "value is negative");

  const bool fixed = specs.format == float_format::fixed;
  if (value <= 0) {  // <= instead of == to silence a warning.
    if (precision <= 0 || !fixed) {
      buf.push_back('0');
      return 0;
    }
    buf.try_resize(to_unsigned(precision));
    std::uninitialized_fill_n(buf.data(), precision, '0');
    return -precision;
  }

  if (!specs.use_grisu) return snprintf_float(value, precision, specs, buf);

  if (precision < 0) {
    // Use Dragonbox for the shortest format.
    if (specs.binary32) {
      auto dec = dragonbox::to_decimal(static_cast<float>(value));
      write<char>(buffer_appender<char>(buf), dec.significand);
      return dec.exponent;
    }
    auto dec = dragonbox::to_decimal(static_cast<double>(value));
    write<char>(buffer_appender<char>(buf), dec.significand);
    return dec.exponent;
  }

  // Use Grisu + Dragon4 for the given precision:
  // https://www.cs.tufts.edu/~nr/cs257/archive/florian-loitsch/printf.pdf.
  int exp = 0;
  const int min_exp = -60;  // alpha in Grisu.
  int cached_exp10 = 0;     // K in Grisu.
  fp normalized = normalize(fp(value));
  const auto cached_pow = get_cached_power(
      min_exp - (normalized.e + fp::significand_size), cached_exp10);
  normalized = normalized * cached_pow;
  // Limit precision to the maximum possible number of significant digits in an
  // IEEE754 double because we don't need to generate zeros.
  const int max_double_digits = 767;
  if (precision > max_double_digits) precision = max_double_digits;
  fixed_handler handler{buf.data(), 0, precision, -cached_exp10, fixed};
  if (grisu_gen_digits(normalized, 1, exp, handler) == digits::error) {
    exp += handler.size - cached_exp10 - 1;
    fallback_format(value, handler.precision, specs.binary32, buf, exp);
  } else {
    exp += handler.exp10;
    buf.try_resize(to_unsigned(handler.size));
  }
  if (!fixed && !specs.showpoint) {
    // Remove trailing zeros.
    auto num_digits = buf.size();
    while (num_digits > 0 && buf[num_digits - 1] == '0') {
      --num_digits;
      ++exp;
    }
    buf.try_resize(num_digits);
  }
  return exp;
}